

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask2_8(uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 2 | *out;
  *out = in[2] << 4 | *out;
  *out = in[3] << 6 | *out;
  *out = in[4] << 8 | *out;
  *out = in[5] << 10 | *out;
  *out = in[6] << 0xc | *out;
  *out = in[7] << 0xe | *out;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask2_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 14;
  ++in;

  return out + 1;
}